

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubDEdgeChain::Write(ON_SubDEdgeChain *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  uint uVar2;
  bool rc;
  uint count;
  ON_BinaryArchive *archive_local;
  ON_SubDEdgeChain *this_local;
  
  uVar2 = ON_SimpleArray<ON_SubDEdgePtr>::UnsignedCount(&this->m_edge_chain);
  if (uVar2 != 0) {
    SetPersistentEdgeIdsFromRuntimeEdgePtrs(this);
  }
  uVar2 = ON_SimpleArray<unsigned_int>::UnsignedCount(&this->m_persistent_edge_id);
  bVar1 = ON_BinaryArchive::BeginWrite3dmAnonymousChunk(archive,1);
  if (bVar1) {
    this_local._7_1_ = false;
    bVar1 = ON_BinaryArchive::WriteUuid(archive,&this->m_persistent_subd_id);
    if (((bVar1) && (bVar1 = ON_BinaryArchive::WriteInt(archive,uVar2), bVar1)) &&
       ((uVar2 == 0 ||
        ((bVar1 = ON_BinaryArchive::WriteArray(archive,&this->m_persistent_edge_id), bVar1 &&
         (bVar1 = ON_BinaryArchive::WriteArray(archive,&this->m_persistent_edge_orientation), bVar1)
         ))))) {
      this_local._7_1_ = true;
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    if (!bVar1) {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDEdgeChain::Write(class ON_BinaryArchive& archive) const
{
  // This write has to work if a read happened but the m_edge_chain[] was never set.
  if (m_edge_chain.UnsignedCount() > 0)
    SetPersistentEdgeIdsFromRuntimeEdgePtrs();
  const unsigned count = m_persistent_edge_id.UnsignedCount();

  if (false == archive.BeginWrite3dmAnonymousChunk(1))
    return false;

  bool rc = false;
  for (;;)
  {
    if (false == archive.WriteUuid(m_persistent_subd_id))
      break;
    if (false == archive.WriteInt(count))
      break;
    if (count > 0)
    {
      if (false == archive.WriteArray(m_persistent_edge_id))
        break;
      if (false == archive.WriteArray(m_persistent_edge_orientation))
        break;
    }

    rc = true;
    break;
  }

  if (false == archive.EndWrite3dmChunk())
    rc = false;

  return rc;
}